

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionBlocker.h
# Opt level: O2

void __thiscall cmFunctionBlocker::~cmFunctionBlocker(cmFunctionBlocker *this)

{
  this->_vptr_cmFunctionBlocker = (_func_int **)&PTR___cxa_pure_virtual_00597010;
  cmListFileContext::~cmListFileContext(&this->StartingContext);
  return;
}

Assistant:

virtual ~cmFunctionBlocker() {}